

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void adjustOrderByCol(ExprList *pOrderBy,ExprList *pEList)

{
  u16 uVar1;
  int t;
  int j;
  int i;
  ExprList *pEList_local;
  ExprList *pOrderBy_local;
  
  if (pOrderBy != (ExprList *)0x0) {
    for (i = 0; i < pOrderBy->nExpr; i = i + 1) {
      uVar1 = pOrderBy->a[i].u.x.iOrderByCol;
      if (uVar1 != 0) {
        for (j = 0; j < pEList->nExpr; j = j + 1) {
          if (pEList->a[j].u.x.iOrderByCol == uVar1) {
            pOrderBy->a[i].u.x.iOrderByCol = (short)j + 1;
            break;
          }
        }
        if (pEList->nExpr <= j) {
          pOrderBy->a[i].u.x.iOrderByCol = 0;
        }
      }
    }
  }
  return;
}

Assistant:

static void adjustOrderByCol(ExprList *pOrderBy, ExprList *pEList){
  int i, j;
  if( pOrderBy==0 ) return;
  for(i=0; i<pOrderBy->nExpr; i++){
    int t = pOrderBy->a[i].u.x.iOrderByCol;
    if( t==0 ) continue;
    for(j=0; j<pEList->nExpr; j++){
      if( pEList->a[j].u.x.iOrderByCol==t ){
        pOrderBy->a[i].u.x.iOrderByCol = j+1;
        break;
      }
    }
    if( j>=pEList->nExpr ){
      pOrderBy->a[i].u.x.iOrderByCol = 0;
    }
  }
}